

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topk_algorithms.cc
# Opt level: O0

void __thiscall
topk_algorithms::ThresholdAlgorithmInstance::add
          (ThresholdAlgorithmInstance *this,Index i,KeyValue *kv)

{
  size_t sVar1;
  Rank *this_00;
  Value VVar2;
  KeyValue *kv_local;
  Index i_local;
  ThresholdAlgorithmInstance *this_local;
  
  sVar1 = rank::RankList::size(&this->_rms_list);
  if (i < sVar1) {
    this_00 = rank::RankList::rank(&this->_rms_list,i);
    rank::Rank::add(this_00,kv);
    VVar2 = rank::KeyValue::value(kv);
    this->_sum = VVar2 + this->_sum;
    return;
  }
  __assert_fail("i < _rms_list.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/laurolins[P]topkube_benchmark/src/topk_algorithms.cc"
                ,0x48,
                "void topk_algorithms::ThresholdAlgorithmInstance::add(Index, const KeyValue &)");
}

Assistant:

void ThresholdAlgorithmInstance::add(Index i, const KeyValue& kv) { assert(i < _rms_list.size()); _rms_list.rank(i)->add(kv); _sum+=kv.value(); }